

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O2

int uv_loop_fork(uv_loop_t *loop)

{
  void **ppvVar1;
  uint uVar2;
  uv__io_t *puVar3;
  long *plVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = uv__io_fork(loop);
  if (iVar5 == 0) {
    iVar5 = uv__async_fork(loop);
    if (iVar5 == 0) {
      iVar5 = uv__signal_loop_fork(loop);
      if (iVar5 == 0) {
        uVar2 = loop->nwatchers;
        iVar5 = 0;
        for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
          puVar3 = loop->watchers[uVar6];
          if (((puVar3 != (uv__io_t *)0x0) && (puVar3->pevents != 0)) &&
             (ppvVar1 = puVar3->watcher_queue, ppvVar1 == (void **)puVar3->watcher_queue[0])) {
            puVar3->events = 0;
            puVar3->watcher_queue[0] = loop->watcher_queue;
            plVar4 = (long *)loop->watcher_queue[1];
            puVar3->watcher_queue[1] = plVar4;
            *plVar4 = (long)ppvVar1;
            loop->watcher_queue[1] = ppvVar1;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int uv_loop_fork(uv_loop_t* loop) {
  int err;
  unsigned int i;
  uv__io_t* w;

  err = uv__io_fork(loop);
  if (err)
    return err;

  err = uv__async_fork(loop);
  if (err)
    return err;

  err = uv__signal_loop_fork(loop);
  if (err)
    return err;

  /* Rearm all the watchers that aren't re-queued by the above. */
  for (i = 0; i < loop->nwatchers; i++) {
    w = loop->watchers[i];
    if (w == NULL)
      continue;

    if (w->pevents != 0 && QUEUE_EMPTY(&w->watcher_queue)) {
      w->events = 0; /* Force re-registration in uv__io_poll. */
      QUEUE_INSERT_TAIL(&loop->watcher_queue, &w->watcher_queue);
    }
  }

  return 0;
}